

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

bool testing::internal::HasGoogleTestFlagPrefix(char *str)

{
  bool bVar1;
  char *local_8;
  
  bVar1 = SkipPrefix("--",&local_8);
  if ((((bVar1) || (bVar1 = SkipPrefix("-",&local_8), bVar1)) ||
      (bVar1 = SkipPrefix("/",&local_8), bVar1)) &&
     (bVar1 = SkipPrefix("gtest_internal_",&local_8), !bVar1)) {
    bVar1 = SkipPrefix("gtest_",&local_8);
    if (bVar1) {
      return true;
    }
    bVar1 = SkipPrefix("gtest-",&local_8);
    return bVar1;
  }
  return false;
}

Assistant:

static bool HasGoogleTestFlagPrefix(const char* str) {
  return (SkipPrefix("--", &str) ||
          SkipPrefix("-", &str) ||
          SkipPrefix("/", &str)) &&
         !SkipPrefix(GTEST_FLAG_PREFIX_ "internal_", &str) &&
         (SkipPrefix(GTEST_FLAG_PREFIX_, &str) ||
          SkipPrefix(GTEST_FLAG_PREFIX_DASH_, &str));
}